

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

void send_recv_start(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined8 *extraout_RDX;
  int iVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auStack_410 [8];
  undefined8 uStack_408;
  undefined1 auStack_400 [8];
  uv_process_t uStack_3f8;
  code *pcStack_370;
  uv_loop_t uStack_368;
  code *pcStack_18;
  
  iVar1 = uv_is_readable(0x2e5e30);
  if (iVar1 == 1) {
    iVar1 = uv_is_writable(0x2e5e30);
    if (iVar1 != 1) goto LAB_00161ecd;
    iVar1 = uv_is_closing(0x2e5e30);
    if (iVar1 != 0) goto LAB_00161ed2;
    iVar1 = uv_read_start(0x2e5e30,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    send_recv_start_cold_1();
LAB_00161ecd:
    send_recv_start_cold_2();
LAB_00161ed2:
    send_recv_start_cold_3();
  }
  send_recv_start_cold_4();
  pcStack_18 = (code *)0x161ee2;
  puVar3 = (uv_loop_t *)uv_default_loop();
  pcStack_18 = (code *)0x161eec;
  run_ipc_send_recv_helper(puVar3,0);
  pcStack_18 = (code *)0x161ef1;
  puVar3 = (uv_loop_t *)uv_default_loop();
  pcStack_18 = (code *)0x161f05;
  uv_walk(puVar3,close_walk_cb,0);
  pcStack_18 = (code *)0x161f0f;
  uv_run(puVar3,0);
  pcStack_18 = (code *)0x161f14;
  uVar4 = uv_default_loop();
  pcStack_18 = (code *)0x161f1c;
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return;
  }
  pcStack_18 = ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_1();
  iVar1 = (int)&uStack_368;
  pcStack_370 = (code *)0x161f39;
  pcStack_18 = (code *)puVar3;
  iVar2 = uv_loop_init();
  if (iVar2 == 0) {
    pcStack_370 = (code *)0x161f4d;
    run_ipc_send_recv_helper(&uStack_368,1);
    pcStack_370 = (code *)0x161f55;
    iVar1 = (int)&uStack_368;
    iVar2 = uv_loop_close();
    puVar3 = &uStack_368;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_370 = (code *)0x161f67;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_370 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  puVar5 = auStack_400;
  puVar7 = auStack_400;
  pcStack_370 = (code *)puVar3;
  if (iVar1 == 0) {
    uStack_408 = (code *)0x161ffc;
    spawn_helper(&ctx.channel,&uStack_3f8,"ipc_send_recv_helper");
    uStack_408 = (code *)0x16200a;
    connect_cb(&ctx.connect_req,0);
LAB_0016200a:
    uStack_408 = (code *)0x16200f;
    puVar5 = (undefined1 *)uv_default_loop();
    iVar6 = 0;
    uStack_408 = (code *)0x162019;
    iVar2 = uv_run();
    if (iVar2 != 0) {
      uStack_408 = (code *)0x162044;
      run_test_cold_3();
LAB_00162044:
      uStack_408 = (code *)0x162049;
      run_test_cold_4();
LAB_00162049:
      uStack_408 = (code *)0x16204e;
      run_test_cold_1();
      goto LAB_0016204e;
    }
    if (recv_cb_count != 2) goto LAB_00162044;
    if (iVar1 == 0) {
      return;
    }
    uStack_408 = (code *)0x162032;
    iVar1 = uv_thread_join();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    iVar6 = 0x161f29;
    uStack_408 = (code *)0x161f8e;
    iVar2 = uv_thread_create(auStack_400,ipc_send_recv_helper_threadproc,0x2a);
    if (iVar2 != 0) goto LAB_00162049;
    uStack_408 = (code *)0x161fa0;
    uv_sleep(1000);
    uStack_408 = (code *)0x161fa5;
    puVar5 = (undefined1 *)uv_default_loop();
    iVar6 = 0x2e6330;
    uStack_408 = (code *)0x161fb9;
    iVar2 = uv_pipe_init(puVar5,&ctx,1);
    if (iVar2 == 0) {
      uStack_408 = (code *)0x161fe2;
      uv_pipe_connect(0x2e6438,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0016200a;
    }
LAB_0016204e:
    puVar7 = puVar5;
    uStack_408 = (code *)0x162053;
    run_test_cold_2();
  }
  uStack_408 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)puVar7 == &ctx.connect_req) {
    if (iVar6 != 0) goto LAB_00162128;
    _auStack_410 = uv_buf_init(".",1);
    iVar1 = uv_write2(0x2e6498,&ctx,auStack_410,1,0x2e6620,0);
    if (iVar1 != 0) goto LAB_0016212d;
    auVar8 = uv_buf_init(".",1);
    _auStack_410 = auVar8;
    iVar1 = uv_write2(0x2e6558,&ctx,auStack_410,1,0x2e6758,0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00162137;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00162128:
    connect_cb_cold_2();
LAB_0016212d:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_00162137:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT(1 == uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT(r == 0);
}